

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetExtraSources
          (cmGeneratorTarget *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *data,string *config)

{
  pointer pSVar1;
  KindedSources *pKVar2;
  SourceAndKind *s;
  pointer __x;
  
  pKVar2 = GetKindedSources(this,config);
  pSVar1 = (pKVar2->Sources).
           super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (pKVar2->Sources).
             super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pSVar1; __x = __x + 1) {
    if (__x->Kind == SourceKindExtra) {
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::push_back
                (data,(value_type *)__x);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetExtraSources(std::vector<cmSourceFile const*>& data,
                                        const std::string& config) const
{
  IMPLEMENT_VISIT(SourceKindExtra);
}